

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O2

bool __thiscall
QPageLayout::setLeftMargin(QPageLayout *this,qreal leftMargin,OutOfBoundsPolicy outOfBoundsPolicy)

{
  double dVar1;
  QPageLayoutPrivate *pQVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  
  pQVar2 = (this->d).d.ptr;
  if ((outOfBoundsPolicy == Clamp) && (pQVar2->m_mode == StandardMode)) {
    dVar5 = (pQVar2->m_maxMargins).m_left;
    if (leftMargin <= dVar5) {
      dVar5 = leftMargin;
    }
    dVar1 = (pQVar2->m_minMargins).m_left;
    leftMargin = dVar5;
    if (dVar5 <= dVar1) {
      leftMargin = dVar1;
    }
  }
  bVar3 = qFuzzyCompare(leftMargin,(pQVar2->m_margins).m_left);
  bVar4 = true;
  if (!bVar3) {
    pQVar2 = (this->d).d.ptr;
    if ((pQVar2->m_mode == FullPageMode) ||
       (((pQVar2->m_minMargins).m_left <= leftMargin &&
        (leftMargin <= (pQVar2->m_maxMargins).m_left)))) {
      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach(&this->d);
      (((this->d).d.ptr)->m_margins).m_left = leftMargin;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool QPageLayout::setLeftMargin(qreal leftMargin, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == StandardMode && outOfBoundsPolicy == OutOfBoundsPolicy::Clamp)
        leftMargin = qBound(d->m_minMargins.left(), leftMargin, d->m_maxMargins.left());

    if (qFuzzyCompare(leftMargin, d->m_margins.left()))
        return true;

    if (d->m_mode == FullPageMode
        || (leftMargin >= d->m_minMargins.left() && leftMargin <= d->m_maxMargins.left())) {
        d.detach();
        d->m_margins.setLeft(leftMargin);
        return true;
    }

    return false;
}